

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O2

void __thiscall ThreadContext::TryExitExpirableCollectMode(ThreadContext *this)

{
  ExpirableObject *this_00;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  ExpirableObject **ppEVar5;
  ExpirableObjectList *pEVar6;
  Iterator local_40;
  
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,ExpirableCollectPhase);
  if (((!bVar2) && (bVar2 = InExpirableCollectMode(this), bVar2)) &&
     (this->disableExpiration == false)) {
    Output::Trace(ExpirableCollectPhase,
                  L"Checking to see whether to complete Expirable Object Collection: GC Count is %d\n"
                  ,(ulong)(uint)this->expirableCollectModeGcCount);
    iVar3 = this->expirableCollectModeGcCount;
    if (0 < iVar3) {
      iVar3 = iVar3 + -1;
      this->expirableCollectModeGcCount = iVar3;
    }
    if ((iVar3 == 0) &&
       ((this->recycler->inCacheCleanupCollection != false || (DAT_0143bfbb == '\x01')))) {
      Output::Trace(ExpirableCollectPhase,L"Completing Expirable Object Collection\n");
      pEVar6 = this->expirableObjectList;
      local_40.list = &pEVar6->super_DListBase<ExpirableObject_*,_RealCount>;
      local_40.current = (NodeBase *)pEVar6;
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      while( true ) {
        if (pEVar6 == (ExpirableObjectList *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                             ,0x66,"(current != nullptr)","current != nullptr");
          if (!bVar2) goto LAB_00712c05;
          *puVar4 = 0;
          pEVar6 = (ExpirableObjectList *)local_40.current;
        }
        local_40.current =
             (pEVar6->super_DListBase<ExpirableObject_*,_RealCount>).
             super_DListNodeBase<ExpirableObject_*>.next.base;
        if ((DListBase<ExpirableObject_*,_RealCount> *)local_40.current == local_40.list) break;
        ppEVar5 = DListBase<ExpirableObject_*,_RealCount>::Iterator::Data(&local_40);
        this_00 = *ppEVar5;
        if (this_00 == (ExpirableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                             ,0xb9b,"(object)","object");
          if (!bVar2) {
LAB_00712c05:
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar4 = 0;
        }
        bVar2 = ExpirableObject::IsObjectUsed(this_00);
        pEVar6 = (ExpirableObjectList *)local_40.current;
        if (!bVar2) {
          (*(this_00->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[6])(this_00);
          pEVar6 = (ExpirableObjectList *)local_40.current;
        }
      }
      this->expirableCollectModeGcCount = -1;
    }
  }
  return;
}

Assistant:

void
ThreadContext::TryExitExpirableCollectMode()
{
    // If this feature is turned off or if we're already in profile collection mode, do nothing
    // We also do nothing if expiration is explicitly disabled by someone lower down the stack
    if (PHASE_OFF1(Js::ExpirableCollectPhase) || !InExpirableCollectMode() || this->disableExpiration)
    {
        return;
    }

    if (InExpirableCollectMode())
    {
        OUTPUT_TRACE(Js::ExpirableCollectPhase, _u("Checking to see whether to complete Expirable Object Collection: GC Count is %d\n"), this->expirableCollectModeGcCount);
        if (this->expirableCollectModeGcCount > 0)
        {
            this->expirableCollectModeGcCount--;
        }

        if (this->expirableCollectModeGcCount == 0 &&
            (this->recycler->InCacheCleanupCollection() || CONFIG_FLAG(ForceExpireOnNonCacheCollect)))
        {
            OUTPUT_TRACE(Js::ExpirableCollectPhase, _u("Completing Expirable Object Collection\n"));

            ExpirableObjectList::Iterator expirableObjectIterator(this->expirableObjectList);

            while (expirableObjectIterator.Next())
            {
                ExpirableObject* object = expirableObjectIterator.Data();

                Assert(object);

                if (!object->IsObjectUsed())
                {
                    object->Expire();
                }
            }

            // Leave expirable collection mode
            expirableCollectModeGcCount = -1;
        }
    }
}